

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O3

void ntt(int k,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *v,bool inv)

{
  iterator __position;
  unsigned_long_long uVar1;
  uint uVar2;
  pointer puVar3;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *pvVar4;
  pointer puVar5;
  ulong uVar6;
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *pvVar7;
  int k_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auStack_78 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> odd;
  undefined1 auStack_58 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> even;
  
  if (k == 0) {
    return;
  }
  auStack_58 = (undefined1  [8])0x0;
  even.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  even.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puVar3 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar3) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pvVar7 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_78;
      if ((uVar9 & 1) == 0) {
        pvVar7 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_58;
      }
      __position._M_current = *(unsigned_long_long **)(pvVar7 + 8);
      if (__position._M_current == *(unsigned_long_long **)(pvVar7 + 0x10)) {
        pvVar7 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_78;
        if ((uVar9 & 1) == 0) {
          pvVar7 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_58;
        }
        std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
        _M_realloc_insert<unsigned_long_long_const&>
                  (pvVar7,__position,(unsigned_long_long *)((long)puVar3 + lVar8));
        puVar3 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar5 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = *(unsigned_long_long *)((long)puVar3 + lVar8);
        *(unsigned_long_long **)(pvVar7 + 8) = __position._M_current + 1;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 8;
    } while (uVar9 < (ulong)((long)puVar5 - (long)puVar3 >> 3));
  }
  k_00 = k + -1;
  ntt(k_00,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_58,inv);
  ntt(k_00,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_78,inv);
  pvVar4 = &wInv;
  if (!inv) {
    pvVar4 = &w;
  }
  if (k_00 == 0x1f) {
    if (auStack_78 == (undefined1  [8])0x0) goto LAB_0011cc11;
  }
  else {
    uVar1 = (pvVar4->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
            _M_impl.super__Vector_impl_data._M_start[k];
    uVar2 = 1 << ((byte)k_00 & 0x1f);
    puVar3 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = 1;
    if (1 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    uVar6 = 1;
    uVar10 = 0;
    do {
      puVar3[uVar10] =
           ((*(pointer)((long)auStack_78 + uVar10 * 8) * uVar6) % 0xc0000001 +
           *(pointer)((long)auStack_58 + uVar10 * 8)) % 0xc0000001;
      puVar3[(long)(int)uVar2 + uVar10] =
           ((((*(pointer)((long)auStack_78 + uVar10 * 8) * uVar6) / 0xc0000001) * 0xc0000001 -
            *(pointer)((long)auStack_78 + uVar10 * 8) * uVar6) +
            *(pointer)((long)auStack_58 + uVar10 * 8) + 0xc0000001) % 0xc0000001;
      uVar6 = (uVar6 * uVar1) % 0xc0000001;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  operator_delete((void *)auStack_78);
LAB_0011cc11:
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58);
  }
  return;
}

Assistant:

void ntt(int k, vector<ull>& v, bool inv) { // n = 2^k
    if (!k) return;
    vector<ull> even, odd;
    rep(i, 0, v.size()) ((i % 2) ? odd : even).push_back(v[i]);
    ntt(k - 1, even, inv);
    ntt(k - 1, odd, inv);
    // (2^k)-th root of unity: omega1^(2^k) = 1 (mod P here)
    ull omega1 = w[k];
    if (inv) omega1 = wInv[k];
    ull omega = 1;
    rep(i, 0, (1 << (k - 1))) {
        v[i] = (even[i] + (omega * odd[i]) % P) % P;
        v[i + (1 << (k - 1))] = (P + even[i] - (omega * odd[i]) % P) % P;
        omega = (omega1 * omega) % P;
    }
}